

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_udp_ref2(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_udp_t h;
  uv_buf_t uStack_310;
  sockaddr_in sStack_300;
  uv_udp_t uStack_2f0;
  uv_udp_send_t uStack_238;
  uv_loop_t *puStack_f0;
  long local_e0;
  long local_d8;
  sockaddr_in local_d0;
  uv_udp_t local_c0;
  
  puStack_f0 = (uv_loop_t *)0x1b5fc6;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_d0);
  local_c0.data = (void *)(long)iVar1;
  local_e0 = 0;
  if (local_c0.data == (void *)0x0) {
    puStack_f0 = (uv_loop_t *)0x1b5feb;
    puVar2 = uv_default_loop();
    puStack_f0 = (uv_loop_t *)0x1b5ffb;
    uv_udp_init(puVar2,&local_c0);
    puStack_f0 = (uv_loop_t *)0x1b600a;
    uv_udp_bind(&local_c0,(sockaddr *)&local_d0,0);
    puStack_f0 = (uv_loop_t *)0x1b601c;
    uv_udp_recv_start(&local_c0,fail_cb,fail_cb);
    puStack_f0 = (uv_loop_t *)0x1b6024;
    uv_unref((uv_handle_t *)&local_c0);
    puStack_f0 = (uv_loop_t *)0x1b6029;
    puVar2 = uv_default_loop();
    puStack_f0 = (uv_loop_t *)0x1b6033;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_f0 = (uv_loop_t *)0x1b603b;
    do_close(&local_c0);
    puStack_f0 = (uv_loop_t *)0x1b6040;
    unaff_RBX = uv_default_loop();
    puStack_f0 = (uv_loop_t *)0x1b6054;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_f0 = (uv_loop_t *)0x1b605e;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_e0 = 0;
    puStack_f0 = (uv_loop_t *)0x1b606c;
    puVar2 = uv_default_loop();
    puStack_f0 = (uv_loop_t *)0x1b6074;
    iVar1 = uv_loop_close(puVar2);
    local_d8 = (long)iVar1;
    if (local_e0 == local_d8) {
      puStack_f0 = (uv_loop_t *)0x1b608c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_f0 = (uv_loop_t *)0x1b60a6;
    run_test_udp_ref2_cold_1();
  }
  puStack_f0 = (uv_loop_t *)run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  puStack_f0 = unaff_RBX;
  uStack_310 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_300);
  uStack_238.data = (void *)(long)iVar1;
  uStack_2f0.data = (void *)0x0;
  if (uStack_238.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    uv_udp_init(puVar2,&uStack_2f0);
    uv_udp_send(&uStack_238,&uStack_2f0,&uStack_310,1,(sockaddr *)&sStack_300,req_cb);
    uv_unref((uv_handle_t *)&uStack_2f0);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (req_cb_called == 1) {
      do_close(&uStack_2f0);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b6208;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001b6208:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_ref2) {
  struct sockaddr_in addr;
  uv_udp_t h;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_bind(&h, (const struct sockaddr*) &addr, 0);
  uv_udp_recv_start(&h, (uv_alloc_cb)fail_cb, (uv_udp_recv_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}